

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<int,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,Eigen::Matrix<int,4,1,0,4,1>>,Eigen::internal::assign_op<int,int>>
               (Matrix<int,__1,_1,_0,__1,_1> *dst,
               CwiseNullaryOp<Eigen::internal::linspaced_op<int>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>
               *src,assign_op<int,_int> *func)

{
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Kernel kernel;
  plainobjectbase_evaluator_data<int,_0> local_60;
  SrcEvaluatorType local_58;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>,_Eigen::internal::assign_op<int,_int>,_0>
  local_38;
  
  local_58.m_functor.impl.m_low = (src->m_functor).impl.m_low;
  local_58.m_functor.impl.m_multiplier = (src->m_functor).impl.m_multiplier;
  local_58.m_functor.impl.m_divisor = (src->m_functor).impl.m_divisor;
  local_58.m_functor.impl.m_use_divisor = (src->m_functor).impl.m_use_divisor;
  local_58.m_functor.impl._13_3_ = *(undefined3 *)&(src->m_functor).impl.field_0xd;
  resize_if_allowed<Eigen::Matrix<int,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,Eigen::Matrix<int,4,1,0,4,1>>,int,int>
            (dst,src,func);
  local_60.data =
       (dst->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_38.m_dst = (DstEvaluatorType *)&local_60;
  local_38.m_src = &local_58;
  local_38.m_functor = func;
  local_38.m_dstExpr = dst;
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>,_Eigen::internal::assign_op<int,_int>,_0>,_1,_0>
  ::run(&local_38);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}